

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex.h
# Opt level: O0

void __thiscall
alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::split_sideways
          (Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false> *this,
          model_node_type *parent,int bucketID,int fanout_tree_depth,
          vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
          *used_fanout_tree_nodes,bool reuse_model)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  int *piVar4;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  AlexModelNode<int,_int,_std::allocator<std::pair<int,_int>_>_> *in_R8;
  undefined1 in_R9B;
  int extra_duplication_factor;
  int start_bucketID;
  int expansion_factor;
  int repeats;
  int fanout;
  data_node_type *leaf;
  undefined7 in_stack_00000050;
  undefined4 in_stack_ffffffffffffffa0;
  int local_50 [2];
  int in_stack_ffffffffffffffb8;
  uint in_stack_ffffffffffffffbc;
  int in_stack_ffffffffffffffc4;
  int local_38;
  undefined3 in_stack_ffffffffffffffdc;
  int local_18;
  int local_14;
  
  lVar1 = *(long *)(*(long *)(in_RSI + 0x38) + (long)in_EDX * 8);
  *(int *)(in_RDI + 0x40) = *(int *)(in_RDI + 0x40) + 1;
  *(long *)(in_RDI + 0x58) = (long)*(int *)(lVar1 + 0x5c) + *(long *)(in_RDI + 0x58);
  local_38 = 1 << (*(byte *)(lVar1 + 9) & 0x1f);
  local_18 = in_ECX;
  local_14 = in_EDX;
  if (local_38 < 1 << ((byte)in_ECX & 0x1f)) {
    *(int *)(in_RDI + 0x44) = *(int *)(in_RDI + 0x44) + 1;
    *(long *)(in_RDI + 0x60) = (long)*(int *)(in_RSI + 0x30) + *(long *)(in_RDI + 0x60);
    in_stack_ffffffffffffffc4 =
         AlexModelNode<int,_int,_std::allocator<std::pair<int,_int>_>_>::expand
                   (in_R8,CONCAT13(in_R9B,in_stack_ffffffffffffffdc) & 0x1ffffff);
    local_38 = in_stack_ffffffffffffffc4 * local_38;
    local_14 = in_stack_ffffffffffffffc4 * local_14;
  }
  iVar3 = local_14 - local_14 % local_38;
  bVar2 = std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>::empty
                    ((vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
                      *)CONCAT44(local_14,in_stack_ffffffffffffffa0));
  if (bVar2) {
    if (local_18 != 1) {
      __assert_fail("fanout_tree_depth == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]ALEX/src/core/alex.h"
                    ,0x67f,
                    "void alex::Alex<int, int, alex::AlexCompare, std::allocator<std::pair<int, int>>, false>::split_sideways(model_node_type *, int, int, std::vector<fanout_tree::FTNode> &, bool) [T = int, P = int, Compare = alex::AlexCompare, Alloc = std::allocator<std::pair<int, int>>, allow_duplicates = false]"
                   );
    }
    in_stack_ffffffffffffffbc = (uint)*(byte *)(lVar1 + 9);
    std::max<int>(&local_18,(int *)&stack0xffffffffffffffbc);
    create_two_new_data_nodes
              ((Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false> *)
               CONCAT44(bucketID,fanout_tree_depth),(data_node_type *)used_fanout_tree_nodes,
               (model_node_type *)CONCAT17(reuse_model,in_stack_00000050),leaf._4_4_,leaf._3_1_,
               fanout);
  }
  else {
    local_50[1] = 0;
    local_50[0] = (uint)*(byte *)(lVar1 + 9) - local_18;
    piVar4 = std::max<int>(local_50 + 1,local_50);
    in_stack_ffffffffffffffb8 = *piVar4;
    create_new_data_nodes
              ((Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false> *)
               CONCAT44(bucketID,fanout_tree_depth),(data_node_type *)used_fanout_tree_nodes,
               (model_node_type *)CONCAT17(reuse_model,in_stack_00000050),leaf._4_4_,
               (vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_> *)
               CONCAT44(fanout,repeats),expansion_factor,(int)this);
  }
  delete_node((Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false> *)
              CONCAT44(in_stack_ffffffffffffffc4,iVar3),
              (AlexNode<int,_int> *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  *(int *)(in_RDI + 0x30) = *(int *)(in_RDI + 0x30) + -1;
  return;
}

Assistant:

void split_sideways(model_node_type* parent, int bucketID,
                      int fanout_tree_depth,
                      std::vector<fanout_tree::FTNode>& used_fanout_tree_nodes,
                      bool reuse_model) {
    auto leaf = static_cast<data_node_type*>(parent->children_[bucketID]);
    stats_.num_sideways_splits++;
    stats_.num_sideways_split_keys += leaf->num_keys_;

    int fanout = 1 << fanout_tree_depth;
    int repeats = 1 << leaf->duplication_factor_;
    if (fanout > repeats) {
      // Expand the pointer array in the parent model node if there are not
      // enough redundant pointers
      stats_.num_model_node_expansions++;
      stats_.num_model_node_expansion_pointers += parent->num_children_;
      int expansion_factor =
          parent->expand(fanout_tree_depth - leaf->duplication_factor_);
      repeats *= expansion_factor;
      bucketID *= expansion_factor;
    }
    int start_bucketID =
        bucketID - (bucketID % repeats);  // first bucket with same child

    if (used_fanout_tree_nodes.empty()) {
      assert(fanout_tree_depth == 1);
      create_two_new_data_nodes(
          leaf, parent,
          std::max(fanout_tree_depth,
                   static_cast<int>(leaf->duplication_factor_)),
          reuse_model, start_bucketID);
    } else {
      // Extra duplication factor is required when there are more redundant
      // pointers than necessary
      int extra_duplication_factor =
          std::max(0, leaf->duplication_factor_ - fanout_tree_depth);
      create_new_data_nodes(leaf, parent, fanout_tree_depth,
                            used_fanout_tree_nodes, start_bucketID,
                            extra_duplication_factor);
    }

    delete_node(leaf);
    stats_.num_data_nodes--;
  }